

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O0

APInt * __thiscall llvm::APInt::clearUnusedBits(APInt *this)

{
  uint64_t *puVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  uint64_t mask;
  uint WordBits;
  APInt *this_local;
  
  uVar4 = 0xffffffffffffffff >> (0x40 - (((char)this->BitWidth - 1U & 0x3f) + 1) & 0x3f);
  bVar2 = isSingleWord(this);
  if (bVar2) {
    (this->U).VAL = uVar4 & (this->U).VAL;
  }
  else {
    puVar1 = (this->U).pVal;
    uVar3 = getNumWords(this);
    puVar1[uVar3 - 1] = uVar4 & puVar1[uVar3 - 1];
  }
  return this;
}

Assistant:

APInt &clearUnusedBits() {
    // Compute how many bits are used in the final word
    unsigned WordBits = ((BitWidth-1) % APINT_BITS_PER_WORD) + 1;

    // Mask out the high bits.
    uint64_t mask = WORD_MAX >> (APINT_BITS_PER_WORD - WordBits);
    if (isSingleWord())
      U.VAL &= mask;
    else
      U.pVal[getNumWords() - 1] &= mask;
    return *this;
  }